

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

void Perform_Justification(FIELD *field,WINDOW_conflict *win)

{
  short sVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int local_28;
  int col;
  int len;
  char *bp;
  WINDOW_conflict *win_local;
  FIELD *field_local;
  
  local_28 = 0;
  pcVar3 = Get_Start_Of_Data(field->buf,field->drows * field->dcols);
  pcVar4 = After_End_Of_Data(field->buf,field->drows * field->dcols);
  iVar2 = (int)pcVar4 - (int)pcVar3;
  if (0 < iVar2) {
    if (((win == (WINDOW_conflict *)0x0) || (field->drows != 1)) ||
       (field->dcols != (int)field->cols)) {
      __assert_fail("win && (field->drows == 1) && (field->dcols == field->cols)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CursesDialog/form/frm_driver.c"
                    ,0x2f2,"void Perform_Justification(FIELD *, WINDOW *)");
    }
    sVar1 = field->just;
    if (sVar1 != 1) {
      if (sVar1 == 2) {
        local_28 = (field->cols - iVar2) / 2;
      }
      else if (sVar1 == 3) {
        local_28 = field->cols - iVar2;
      }
    }
    wmove(win,0,local_28);
    waddnstr(win,pcVar3,iVar2);
  }
  return;
}

Assistant:

static void Perform_Justification(FIELD  * field, WINDOW * win)
{
  char *bp;
  int len;
  int col  = 0;

  bp  = Get_Start_Of_Data(field->buf,Buffer_Length(field));
  len = (int)(After_End_Of_Data(field->buf,Buffer_Length(field)) - bp);

  if (len>0)
    {
      assert(win && (field->drows == 1) && (field->dcols == field->cols));

      switch(field->just)
        {
        case JUSTIFY_LEFT:
          break;
        case JUSTIFY_CENTER:
          col = (field->cols - len)/2;
          break;
        case JUSTIFY_RIGHT:
          col = field->cols - len;
          break;
        default:
          break;
        }

      wmove(win,0,col);
      waddnstr(win,bp,len);
    }
}